

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

UObject * __thiscall icu_63::CalendarService::cloneInstance(CalendarService *this,UObject *instance)

{
  int iVar1;
  undefined4 extraout_var;
  long *local_38;
  UnicodeString *s;
  UObject *instance_local;
  CalendarService *this_local;
  
  if (instance == (UObject *)0x0) {
    local_38 = (long *)0x0;
  }
  else {
    local_38 = (long *)__dynamic_cast(instance,&UObject::typeinfo,&UnicodeString::typeinfo,0);
  }
  if (local_38 == (long *)0x0) {
    iVar1 = (*instance->_vptr_UObject[3])();
    this_local = (CalendarService *)CONCAT44(extraout_var,iVar1);
  }
  else {
    this_local = (CalendarService *)(**(code **)(*local_38 + 0x38))();
  }
  return (UObject *)this_local;
}

Assistant:

virtual UObject* cloneInstance(UObject* instance) const {
        UnicodeString *s = dynamic_cast<UnicodeString *>(instance);
        if(s != NULL) {
            return s->clone();
        } else {
#ifdef U_DEBUG_CALSVC_F
            UErrorCode status2 = U_ZERO_ERROR;
            fprintf(stderr, "Cloning a %s calendar with tz=%ld\n", ((Calendar*)instance)->getType(), ((Calendar*)instance)->get(UCAL_ZONE_OFFSET, status2));
#endif
            return ((Calendar*)instance)->clone();
        }
    }